

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFListTable.h
# Opt level: O3

Error __thiscall
llvm::DWARFListTableBase<llvm::DWARFDebugRnglist>::extract
          (DWARFListTableBase<llvm::DWARFDebugRnglist> *this,DWARFDataExtractor Data,
          uint64_t *OffsetPtr)

{
  undefined1 uVar1;
  uint64_t *puVar2;
  DWARFDataExtractor Data_00;
  ulong uVar3;
  uint64_t uVar4;
  mapped_type *this_00;
  ulong *in_RDX;
  size_t in_R9;
  uint64_t *OffsetPtr_00;
  StringRef SectionName;
  uint64_t *local_60;
  uint64_t Off;
  uint64_t local_50;
  undefined1 auStack_48 [8];
  DWARFDebugRnglist CurrentList;
  
  *OffsetPtr = 0;
  OffsetPtr[1] = 0;
  if (OffsetPtr[3] != OffsetPtr[2]) {
    OffsetPtr[3] = OffsetPtr[2];
  }
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_llvm::DWARFDebugRnglist>,_std::_Select1st<std::pair<const_unsigned_long,_llvm::DWARFDebugRnglist>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFDebugRnglist>_>_>
  ::clear((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_llvm::DWARFDebugRnglist>,_std::_Select1st<std::pair<const_unsigned_long,_llvm::DWARFDebugRnglist>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFDebugRnglist>_>_>
           *)(OffsetPtr + 0xb));
  DWARFListTableHeader::extract(&this->Header,Data,OffsetPtr);
  uVar3 = (this->Header).HeaderData.Length & 0xfffffffffffffffe;
  (this->Header).HeaderData.Length = uVar3 != 0 | uVar3;
  if (uVar3 == 0) {
    uVar1 = *(undefined1 *)((long)OffsetPtr + 10);
    local_50 = OffsetPtr[6];
    Off = (uint64_t)(OffsetPtr + 0xb);
    uVar4 = DWARFListTableHeader::length((DWARFListTableHeader *)OffsetPtr);
    OffsetPtr_00 = (uint64_t *)(uVar4 + local_50);
    while (puVar2 = (uint64_t *)*in_RDX, puVar2 < OffsetPtr_00) {
      auStack_48 = (undefined1  [8])0x0;
      CurrentList.super_DWARFListType<llvm::RangeListEntry>.Entries.
      super__Vector_base<llvm::RangeListEntry,_std::allocator<llvm::RangeListEntry>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      CurrentList.super_DWARFListType<llvm::RangeListEntry>.Entries.
      super__Vector_base<llvm::RangeListEntry,_std::allocator<llvm::RangeListEntry>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      Data_00.super_DataExtractor.AddressSize = uVar1;
      Data_00.super_DataExtractor.IsLittleEndian = Data.super_DataExtractor.IsLittleEndian;
      Data_00.super_DataExtractor._18_6_ = Data.super_DataExtractor._18_6_;
      Data_00.super_DataExtractor.Data = Data.super_DataExtractor.Data;
      Data_00.Obj = Data.Obj;
      Data_00.Section = Data.Section;
      SectionName.Length = in_R9;
      SectionName.Data = (char *)in_RDX;
      local_60 = puVar2;
      DWARFListType<llvm::RangeListEntry>::extract
                ((DWARFListType<llvm::RangeListEntry> *)this,Data_00,(uint64_t)auStack_48,
                 OffsetPtr[6],OffsetPtr_00,SectionName,*(StringRef *)(OffsetPtr + 7));
      uVar3 = (this->Header).HeaderData.Length & 0xfffffffffffffffe;
      (this->Header).HeaderData.Length = uVar3 != 0 | uVar3;
      if (uVar3 != 0) {
        if (auStack_48 == (undefined1  [8])0x0) {
          return (Error)(ErrorInfoBase *)this;
        }
        operator_delete((void *)auStack_48,
                        (long)CurrentList.super_DWARFListType<llvm::RangeListEntry>.Entries.
                              super__Vector_base<llvm::RangeListEntry,_std::allocator<llvm::RangeListEntry>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_48);
        return (Error)(ErrorInfoBase *)this;
      }
      this_00 = std::
                map<unsigned_long,_llvm::DWARFDebugRnglist,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFDebugRnglist>_>_>
                ::operator[]((map<unsigned_long,_llvm::DWARFDebugRnglist,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFDebugRnglist>_>_>
                              *)Off,(key_type_conflict *)&local_60);
      std::vector<llvm::RangeListEntry,_std::allocator<llvm::RangeListEntry>_>::operator=
                ((vector<llvm::RangeListEntry,_std::allocator<llvm::RangeListEntry>_> *)this_00,
                 (vector<llvm::RangeListEntry,_std::allocator<llvm::RangeListEntry>_> *)auStack_48);
      if (auStack_48 != (undefined1  [8])0x0) {
        operator_delete((void *)auStack_48,
                        (long)CurrentList.super_DWARFListType<llvm::RangeListEntry>.Entries.
                              super__Vector_base<llvm::RangeListEntry,_std::allocator<llvm::RangeListEntry>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_48);
      }
    }
    if (puVar2 != OffsetPtr_00) {
      __assert_fail("*OffsetPtr == End && \"mismatch between expected length of table and length \" \"of extracted data\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/DebugInfo/DWARF/DWARFListTable.h"
                    ,0xd4,
                    "Error llvm::DWARFListTableBase<llvm::DWARFDebugRnglist>::extract(DWARFDataExtractor, uint64_t *) [DWARFListType = llvm::DWARFDebugRnglist]"
                   );
    }
    (this->Header).HeaderData.Length = 1;
  }
  return (Error)(ErrorInfoBase *)this;
}

Assistant:

Error DWARFListTableBase<DWARFListType>::extract(DWARFDataExtractor Data,
                                                 uint64_t *OffsetPtr) {
  clear();
  if (Error E = extractHeaderAndOffsets(Data, OffsetPtr))
    return E;

  Data.setAddressSize(Header.getAddrSize());
  uint64_t End = getHeaderOffset() + Header.length();
  while (*OffsetPtr < End) {
    DWARFListType CurrentList;
    uint64_t Off = *OffsetPtr;
    if (Error E = CurrentList.extract(Data, getHeaderOffset(), End, OffsetPtr,
                                      Header.getSectionName(),
                                      Header.getListTypeString()))
      return E;
    ListMap[Off] = CurrentList;
  }

  assert(*OffsetPtr == End &&
         "mismatch between expected length of table and length "
         "of extracted data");
  return Error::success();
}